

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall libcellml::Variable::VariableImpl::cleanExpiredVariables(VariableImpl *this)

{
  __normal_iterator<std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
  local_48;
  const_iterator local_40;
  weak_ptr<libcellml::Variable> *local_30;
  weak_ptr<libcellml::Variable> *local_28;
  __normal_iterator<std::weak_ptr<libcellml::Variable>_*,_std::vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>_>
  local_20;
  const_iterator local_18;
  VariableImpl *local_10;
  VariableImpl *this_local;
  
  local_10 = this;
  local_28 = (weak_ptr<libcellml::Variable> *)
             std::
             vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
             ::begin(&this->mEquivalentVariables);
  local_30 = (weak_ptr<libcellml::Variable> *)
             std::
             vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
             ::end(&this->mEquivalentVariables);
  local_20 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::weak_ptr<libcellml::Variable>*,std::vector<std::weak_ptr<libcellml::Variable>,std::allocator<std::weak_ptr<libcellml::Variable>>>>,libcellml::Variable::VariableImpl::cleanExpiredVariables()::__0>
                       (local_28,local_30);
  __gnu_cxx::
  __normal_iterator<std::weak_ptr<libcellml::Variable>const*,std::vector<std::weak_ptr<libcellml::Variable>,std::allocator<std::weak_ptr<libcellml::Variable>>>>
  ::__normal_iterator<std::weak_ptr<libcellml::Variable>*>
            ((__normal_iterator<std::weak_ptr<libcellml::Variable>const*,std::vector<std::weak_ptr<libcellml::Variable>,std::allocator<std::weak_ptr<libcellml::Variable>>>>
              *)&local_18,&local_20);
  local_48._M_current =
       (weak_ptr<libcellml::Variable> *)
       std::
       vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
       ::end(&this->mEquivalentVariables);
  __gnu_cxx::
  __normal_iterator<std::weak_ptr<libcellml::Variable>const*,std::vector<std::weak_ptr<libcellml::Variable>,std::allocator<std::weak_ptr<libcellml::Variable>>>>
  ::__normal_iterator<std::weak_ptr<libcellml::Variable>*>
            ((__normal_iterator<std::weak_ptr<libcellml::Variable>const*,std::vector<std::weak_ptr<libcellml::Variable>,std::allocator<std::weak_ptr<libcellml::Variable>>>>
              *)&local_40,&local_48);
  std::
  vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>::
  erase(&this->mEquivalentVariables,local_18,local_40);
  return;
}

Assistant:

void Variable::VariableImpl::cleanExpiredVariables()
{
    mEquivalentVariables.erase(std::remove_if(mEquivalentVariables.begin(), mEquivalentVariables.end(), [=](const VariableWeakPtr &variableWeak) -> bool { return variableWeak.expired(); }), mEquivalentVariables.end());
}